

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O0

string * __thiscall
flatbuffers::SimpleFloatConstantGenerator::Inf_abi_cxx11_
          (string *__return_storage_ptr__,SimpleFloatConstantGenerator *this,double v)

{
  string *local_40;
  double v_local;
  SimpleFloatConstantGenerator *this_local;
  
  if (0.0 <= v) {
    local_40 = (string *)&this->pos_inf_number_;
  }
  else {
    local_40 = (string *)&this->neg_inf_number_;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleFloatConstantGenerator::Inf(double v) const {
  return (v < 0) ? neg_inf_number_ : pos_inf_number_;
}